

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O2

REF_STATUS ref_validation_node_cell(REF_CELL ref_cell,REF_INT node)

{
  uint uVar1;
  int iVar2;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  REF_INT nodes [27];
  REF_ADJ pRVar3;
  
  uVar1 = printf("node %d\n");
  pRVar3 = (REF_ADJ)(ulong)uVar1;
  uVar4 = 0xffffffffffffffff;
  uVar8 = 0xffffffff;
  uVar6 = 0xffffffff;
  if (-1 < node) {
    pRVar3 = ref_cell->ref_adj;
    uVar8 = 0xffffffff;
    uVar6 = 0xffffffff;
    if (node < pRVar3->nnode) {
      uVar1 = pRVar3->first[(uint)node];
      uVar8 = 0xffffffff;
      uVar6 = 0xffffffff;
      if ((long)(int)uVar1 != -1) {
        pRVar3 = (REF_ADJ)pRVar3->item;
        uVar6 = (ulong)(uint)(&pRVar3->nitem)[(long)(int)uVar1 * 2];
        uVar8 = (ulong)uVar1;
      }
    }
  }
  while( true ) {
    if ((int)uVar8 == -1) {
      return (REF_STATUS)pRVar3;
    }
    printf("cell %d:",uVar6);
    uVar1 = ref_cell_nodes(ref_cell,(REF_INT)uVar6,nodes);
    if (uVar1 != 0) break;
    for (lVar7 = 0; lVar7 < ref_cell->node_per; lVar7 = lVar7 + 1) {
      printf(" %d",(ulong)(uint)nodes[lVar7]);
    }
    putchar(10);
    pRVar3 = (REF_ADJ)ref_cell->ref_adj->item;
    uVar8 = (ulong)(&pRVar3->nnode)[(long)(int)uVar8 * 2];
    uVar5 = uVar4 & 0xffffffff;
    uVar6 = uVar4 & 0xffffffff;
    uVar4 = uVar5;
    if (uVar8 != 0xffffffffffffffff) {
      uVar6 = (ulong)(uint)(&pRVar3->nitem)[uVar8 * 2];
    }
  }
  iVar2 = printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0xde,"ref_validation_node_cell",(ulong)uVar1,"get cell");
  return iVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_validation_node_cell(REF_CELL ref_cell,
                                                   REF_INT node) {
  REF_INT item, cell, cell_node, nodes[REF_CELL_MAX_SIZE_PER];
  printf("node %d\n", node);
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    printf("cell %d:", cell);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "get cell");
    for (cell_node = 0; cell_node < ref_cell_node_per(ref_cell); cell_node++) {
      printf(" %d", nodes[cell_node]);
    }
    printf("\n");
  }
  return REF_SUCCESS;
}